

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_text.c
# Opt level: O2

void * qlist_new(void)

{
  t_textbuf *x;
  t_symbol *sym;
  _clock *p_Var1;
  t_pd p_Var2;
  
  x = (t_textbuf *)pd_new(qlist_class);
  sym = gensym("qlist");
  textbuf_init(x,sym);
  p_Var1 = clock_new(x,qlist_tick);
  x[1].b_ob.te_binbuf = (_binbuf *)p_Var1;
  outlet_new((t_object *)x,&s_list);
  p_Var2 = (t_pd)outlet_new((t_object *)x,&s_bang);
  x[1].b_ob.te_g.g_pd = p_Var2;
  *(undefined4 *)&x[1].b_ob.te_g.g_next = 0x7fffffff;
  *(undefined4 *)&x[1].b_ob.te_outlet = 0x3f800000;
  x[1].b_ob.te_inlet = (_inlet *)0x0;
  x[1].b_ob.te_xpix = 0;
  x[1].b_ob.te_ypix = 0;
  x[1].b_ob.te_width = 0;
  *(undefined2 *)&x[1].b_ob.field_0x2e = 0;
  *(undefined4 *)&x[1].b_binbuf = 0;
  return x;
}

Assistant:

static void *qlist_new(void)
{
    t_qlist *x = (t_qlist *)pd_new(qlist_class);
    textbuf_init(&x->x_textbuf, gensym("qlist"));
    x->x_clock = clock_new(x, (t_method)qlist_tick);
    outlet_new(&x->x_ob, &s_list);
    x->x_bangout = outlet_new(&x->x_ob, &s_bang);
    x->x_onset = 0x7fffffff;
    x->x_tempo = 1;
    x->x_whenclockset = 0;
    x->x_clockdelay = 0;
    x->x_rewound = x->x_innext = 0;
    return (x);
}